

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O0

REF_STATUS ref_clump_around(REF_GRID ref_grid,REF_INT node,char *filename)

{
  REF_CELL pRVar1;
  REF_DICT ref_dict_00;
  REF_DICT ref_dict_01;
  uint uVar2;
  FILE *__stream;
  REF_INT local_128;
  REF_INT local_124;
  int local_120;
  REF_INT local_11c;
  REF_INT local_118;
  int local_114;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  FILE *f;
  char *zonetype;
  REF_INT nodes [27];
  REF_INT cell_node;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_DICT ref_dict;
  REF_DICT tet_dict;
  REF_DICT tri_dict;
  REF_DICT node_dict;
  char *filename_local;
  REF_GRID pRStack_18;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  node_dict = (REF_DICT)filename;
  filename_local._4_4_ = node;
  pRStack_18 = ref_grid;
  uVar2 = ref_dict_create(&tri_dict);
  if (uVar2 == 0) {
    uVar2 = ref_dict_create(&tet_dict);
    if (uVar2 == 0) {
      uVar2 = ref_dict_create(&ref_dict);
      ref_dict_01 = tet_dict;
      if (uVar2 == 0) {
        pRVar1 = pRStack_18->cell[3];
        if ((filename_local._4_4_ < 0) || (pRVar1->ref_adj->nnode <= filename_local._4_4_)) {
          local_114 = -1;
        }
        else {
          local_114 = pRVar1->ref_adj->first[filename_local._4_4_];
        }
        cell_node = local_114;
        if (local_114 == -1) {
          local_118 = -1;
        }
        else {
          local_118 = pRVar1->ref_adj->item[local_114].ref;
        }
        nodes[0x1a] = local_118;
        while (ref_dict_00 = ref_dict, cell_node != -1) {
          uVar2 = ref_cell_nodes(pRVar1,nodes[0x1a],(REF_INT *)&zonetype);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x8c,"ref_clump_around",(ulong)uVar2,"n");
            return uVar2;
          }
          uVar2 = ref_dict_store(ref_dict_01,nodes[0x1a],0);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x8d,"ref_clump_around",(ulong)uVar2,"store");
            return uVar2;
          }
          for (nodes[0x19] = 0; nodes[0x19] < pRVar1->node_per; nodes[0x19] = nodes[0x19] + 1) {
            uVar2 = ref_dict_store(tri_dict,nodes[(long)nodes[0x19] + -2],0);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x8f,"ref_clump_around",(ulong)uVar2,"store");
              return uVar2;
            }
          }
          cell_node = pRVar1->ref_adj->item[cell_node].next;
          if (cell_node == -1) {
            local_11c = -1;
          }
          else {
            local_11c = pRVar1->ref_adj->item[cell_node].ref;
          }
          nodes[0x1a] = local_11c;
        }
        pRVar1 = pRStack_18->cell[8];
        if ((filename_local._4_4_ < 0) || (pRVar1->ref_adj->nnode <= filename_local._4_4_)) {
          local_120 = -1;
        }
        else {
          local_120 = pRVar1->ref_adj->first[filename_local._4_4_];
        }
        cell_node = local_120;
        if (local_120 == -1) {
          local_124 = -1;
        }
        else {
          local_124 = pRVar1->ref_adj->item[local_120].ref;
        }
        nodes[0x1a] = local_124;
        while (cell_node != -1) {
          uVar2 = ref_cell_nodes(pRVar1,nodes[0x1a],(REF_INT *)&zonetype);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x94,"ref_clump_around",(ulong)uVar2,"n");
            return uVar2;
          }
          uVar2 = ref_dict_store(ref_dict_00,nodes[0x1a],0);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x95,"ref_clump_around",(ulong)uVar2,"store");
            return uVar2;
          }
          for (nodes[0x19] = 0; nodes[0x19] < pRVar1->node_per; nodes[0x19] = nodes[0x19] + 1) {
            uVar2 = ref_dict_store(tri_dict,nodes[(long)nodes[0x19] + -2],0);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x97,"ref_clump_around",(ulong)uVar2,"store");
              return uVar2;
            }
          }
          cell_node = pRVar1->ref_adj->item[cell_node].next;
          if (cell_node == -1) {
            local_128 = -1;
          }
          else {
            local_128 = pRVar1->ref_adj->item[cell_node].ref;
          }
          nodes[0x1a] = local_128;
        }
        __stream = fopen((char *)node_dict,"w");
        if (__stream == (FILE *)0x0) {
          printf("unable to open %s\n",node_dict);
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x9c,"ref_clump_around","unable to open file");
          ref_grid_local._4_4_ = 2;
        }
        else {
          fprintf(__stream,"title=\"tecplot refine clump file\"\n");
          fprintf(__stream,"variables = \"x\" \"y\" \"z\" \"xm\" \"ym\" \"zm\" \"g\"\n");
          uVar2 = ref_clump_zone_around
                            ((FILE *)__stream,pRStack_18->cell[3],tet_dict,"fetriangle",tri_dict,
                             pRStack_18->node,filename_local._4_4_);
          if (uVar2 == 0) {
            uVar2 = ref_clump_zone_around
                              ((FILE *)__stream,pRStack_18->cell[8],ref_dict,"fetetrahedron",
                               tri_dict,pRStack_18->node,filename_local._4_4_);
            if (uVar2 == 0) {
              fclose(__stream);
              uVar2 = ref_dict_free(ref_dict);
              if (uVar2 == 0) {
                uVar2 = ref_dict_free(tet_dict);
                if (uVar2 == 0) {
                  ref_grid_local._4_4_ = ref_dict_free(tri_dict);
                  if (ref_grid_local._4_4_ == 0) {
                    ref_grid_local._4_4_ = 0;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                           ,0xb3,"ref_clump_around",(ulong)ref_grid_local._4_4_,"free nodes");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                         ,0xb2,"ref_clump_around",(ulong)uVar2,"free tris");
                  ref_grid_local._4_4_ = uVar2;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                       ,0xb1,"ref_clump_around",(ulong)uVar2,"free tet");
                ref_grid_local._4_4_ = uVar2;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0xad,"ref_clump_around",(ulong)uVar2,"zone");
              ref_grid_local._4_4_ = uVar2;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0xa6,"ref_clump_around",(ulong)uVar2,"zone");
            ref_grid_local._4_4_ = uVar2;
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0x87,"ref_clump_around",(ulong)uVar2,"create tets");
        ref_grid_local._4_4_ = uVar2;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x86,
             "ref_clump_around",(ulong)uVar2,"create tris");
      ref_grid_local._4_4_ = uVar2;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x85,
           "ref_clump_around",(ulong)uVar2,"create nodes");
    ref_grid_local._4_4_ = uVar2;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_clump_around(REF_GRID ref_grid, REF_INT node,
                                    const char *filename) {
  REF_DICT node_dict, tri_dict, tet_dict;
  REF_DICT ref_dict;
  REF_CELL ref_cell;
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  const char *zonetype;

  FILE *f;

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&tri_dict), "create tris");
  RSS(ref_dict_create(&tet_dict), "create tets");

  ref_cell = ref_grid_tri(ref_grid);
  ref_dict = tri_dict;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  ref_cell = ref_grid_tet(ref_grid);
  ref_dict = tet_dict;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine clump file\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\" \"xm\" \"ym\" \"zm\" \"g\"\n");

  ref_cell = ref_grid_tri(ref_grid);
  ref_dict = tri_dict;
  zonetype = "fetriangle";
  RSS(ref_clump_zone_around(f, ref_cell, ref_dict, zonetype, node_dict,
                            ref_grid_node(ref_grid), node),
      "zone");

  ref_cell = ref_grid_tet(ref_grid);
  ref_dict = tet_dict;
  zonetype = "fetetrahedron";
  RSS(ref_clump_zone_around(f, ref_cell, ref_dict, zonetype, node_dict,
                            ref_grid_node(ref_grid), node),
      "zone");

  fclose(f);

  RSS(ref_dict_free(tet_dict), "free tet");
  RSS(ref_dict_free(tri_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  return REF_SUCCESS;
}